

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError str2tls_max(long *val,char *str)

{
  long lVar1;
  int iVar2;
  long lVar3;
  ParameterError PVar4;
  
  if (str == (char *)0x0) {
    PVar4 = PARAM_REQUIRES_PARAMETER;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0x60) {
        return PARAM_BAD_USE;
      }
      iVar2 = strcmp(str,*(char **)((long)&str2tls_max::tls_max_array[0].tls_max_str + lVar3));
      lVar1 = lVar3 + 0x10;
    } while (iVar2 != 0);
    *val = *(long *)((long)&str2tls_max::tls_max_array[0].tls_max + lVar3);
    PVar4 = PARAM_OK;
  }
  return PVar4;
}

Assistant:

ParameterError str2tls_max(long *val, const char *str)
{
   static struct s_tls_max {
    const char *tls_max_str;
    long tls_max;
  } const tls_max_array[] = {
    { "default", CURL_SSLVERSION_MAX_DEFAULT },
    { "1.0",     CURL_SSLVERSION_MAX_TLSv1_0 },
    { "1.1",     CURL_SSLVERSION_MAX_TLSv1_1 },
    { "1.2",     CURL_SSLVERSION_MAX_TLSv1_2 },
    { "1.3",     CURL_SSLVERSION_MAX_TLSv1_3 }
  };
  size_t i = 0;
  if(!str)
    return PARAM_REQUIRES_PARAMETER;
  for(i = 0; i < CURL_ARRAYSIZE(tls_max_array); i++) {
    if(!strcmp(str, tls_max_array[i].tls_max_str)) {
      *val = tls_max_array[i].tls_max;
      return PARAM_OK;
    }
  }
  return PARAM_BAD_USE;
}